

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O1

void __thiscall
QColorDialogPrivate::updateColorLabelText(QColorDialogPrivate *this,QPoint *globalPos)

{
  QLabel *this_00;
  long in_FS_OFFSET;
  QArrayData *local_70 [3];
  QArrayData *local_58 [3];
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->lblScreenColorInfo;
  if (this_00 != (QLabel *)0x0) {
    QMetaObject::tr((char *)local_70,(char *)&QColorDialog::staticMetaObject,0x6f375b);
    QString::arg_impl((longlong)local_58,(int)local_70,(globalPos->xp).m_i,(QChar)0x0);
    QString::arg_impl((longlong)&local_40,(int)local_58,(globalPos->yp).m_i,(QChar)0x0);
    QLabel::setText(this_00,&local_40);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_58[0] != (QArrayData *)0x0) {
      LOCK();
      (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58[0],2,0x10);
      }
    }
    if (local_70[0] != (QArrayData *)0x0) {
      LOCK();
      (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_70[0],2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorDialogPrivate::updateColorLabelText(const QPoint &globalPos)
{
    if (lblScreenColorInfo)
        lblScreenColorInfo->setText(QColorDialog::tr("Cursor at %1, %2\nPress ESC to cancel")
                                .arg(globalPos.x())
                                .arg(globalPos.y()));
}